

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http1_parser.c
# Opt level: O2

size_t http1_fio_parser_fn(http1_fio_parser_args_s *args)

{
  ssize_t *psVar1;
  _func_int_http1_parser_s_ptr_size_t_char_ptr_size_t *p_Var2;
  byte bVar3;
  uint8_t uVar4;
  int iVar5;
  __int32_t **pp_Var6;
  long lVar7;
  byte bVar8;
  long lVar9;
  uint8_t *t;
  byte *pbVar10;
  http1_parser_s *phVar11;
  byte bVar12;
  byte *pbVar13;
  size_t sVar14;
  uint8_t *puVar15;
  byte *pbVar16;
  byte *pbVar17;
  uint8_t *puVar18;
  byte *pbVar19;
  uint8_t *puVar20;
  bool bVar21;
  size_t sStack_60;
  byte *local_58;
  byte *local_50;
  uint8_t *end;
  byte *local_40;
  byte *local_38;
  
  phVar11 = args->parser;
  (phVar11->state).next = (uint8_t *)0x0;
  local_50 = (byte *)args->buffer;
  local_38 = local_50 + args->length;
  bVar3 = (phVar11->state).reserved;
  end = local_50;
LAB_0014fe82:
  bVar8 = bVar3 & 0xf;
  pbVar17 = local_50;
  pbVar10 = local_50;
  if (bVar8 == 0) {
    while (((pbVar10 < local_38 && ((ulong)*pbVar10 < 0x21)) &&
           ((0x100002401U >> ((ulong)*pbVar10 & 0x3f) & 1) != 0))) {
      pbVar17 = pbVar17 + 1;
      pbVar10 = pbVar10 + 1;
    }
    end = pbVar10;
    bVar3 = seek2eol(&end,local_38);
    puVar18 = end;
    if (bVar3 == 0) goto LAB_00150539;
    bVar8 = *pbVar10;
    if ((((ulong)bVar8 == 0x48) && (pbVar10[1] == 0x54)) &&
       ((pbVar10[2] == 0x54 && (pbVar10[3] == 0x50)))) {
      puVar15 = end + (1 - (ulong)bVar3);
      puVar20 = &(args->parser->state).reserved;
      *puVar20 = *puVar20 | 0x80;
      local_58 = pbVar10;
      uVar4 = seek2ch(&local_58,puVar15,' ');
      pbVar16 = local_58;
      if ((uVar4 == '\0') ||
         (iVar5 = (*args->on_http_version)
                            (args->parser,(char *)pbVar10,(long)local_58 - (long)pbVar17),
         iVar5 != 0)) goto LAB_00150508;
      local_58 = pbVar16 + 1;
      uVar4 = seek2ch(&local_58,puVar15,' ');
      if (uVar4 == '\0') goto LAB_00150508;
      phVar11 = args->parser;
      p_Var2 = args->on_status;
      sVar14 = atol((char *)(pbVar16 + 1));
      iVar5 = (*p_Var2)(phVar11,sVar14,(char *)(local_58 + 1),(long)puVar15 - (long)local_58);
LAB_001501ae:
      if (iVar5 != 0) goto LAB_00150508;
    }
    else {
      pp_Var6 = __ctype_tolower_loc();
      puVar18 = end;
      if ((*pp_Var6)[bVar8] - 0x61U < 0x1a) {
        pbVar13 = end + (1 - (ulong)bVar3);
        local_40 = (byte *)0x0;
        local_58 = pbVar10;
        uVar4 = seek2ch(&local_58,pbVar13,' ');
        pbVar16 = local_58;
        if ((uVar4 == '\0') ||
           (iVar5 = (*args->on_method)(args->parser,(char *)pbVar10,(long)local_58 - (long)pbVar17),
           iVar5 != 0)) goto LAB_00150508;
        pbVar17 = pbVar16 + 1;
        if (pbVar16[1] == 0x68) {
          if (((pbVar16[2] != 0x74) || (pbVar16[3] != 0x74)) || (pbVar16[4] != 0x70)) {
LAB_001500c7:
            pbVar16 = (byte *)0x0;
            goto LAB_001500ca;
          }
          if (pbVar16[5] == 0x73) {
            if ((pbVar16[6] == 0x3a) && (pbVar16[7] == 0x2f)) {
              bVar3 = pbVar16[8];
              sStack_60 = 9;
              goto LAB_00150077;
            }
            goto LAB_001500c7;
          }
          if ((pbVar16[5] != 0x3a) || (pbVar16[6] != 0x2f)) goto LAB_001500c7;
          bVar3 = pbVar16[7];
          sStack_60 = 8;
LAB_00150077:
          if (bVar3 != 0x2f) goto LAB_001500c7;
          pbVar16 = pbVar16 + sStack_60;
          local_58 = pbVar16;
          local_40 = pbVar16;
          uVar4 = seek2ch(&local_58,pbVar13,' ');
          pbVar10 = local_58;
          if (uVar4 == '\0') goto LAB_00150508;
          *local_58 = 0x20;
          uVar4 = seek2ch(&local_40,local_58,'/');
          if (uVar4 != '\0') {
            *local_40 = 0x2f;
            pbVar17 = local_40;
            goto LAB_001500ca;
          }
          phVar11 = args->parser;
          pbVar17 = (byte *)0x154d1a;
          sStack_60 = 1;
LAB_0015015c:
          iVar5 = (*args->on_path)(phVar11,(char *)pbVar17,sStack_60);
LAB_0015015f:
          if (iVar5 != 0) goto LAB_00150508;
        }
        else {
          pbVar16 = (byte *)0x0;
LAB_001500ca:
          local_58 = pbVar17;
          uVar4 = seek2ch(&local_58,pbVar13,'?');
          pbVar19 = local_58;
          if (uVar4 == '\0') {
            local_58 = pbVar17;
            uVar4 = seek2ch(&local_58,pbVar13,' ');
            if (uVar4 != '\0') {
              phVar11 = args->parser;
              sStack_60 = (long)local_58 - (long)pbVar17;
              pbVar10 = local_58;
              goto LAB_0015015c;
            }
            goto LAB_00150508;
          }
          iVar5 = (*args->on_path)(args->parser,(char *)pbVar17,(long)local_58 - (long)pbVar17);
          if (iVar5 != 0) goto LAB_00150508;
          pbVar19 = pbVar19 + 1;
          local_58 = pbVar19;
          uVar4 = seek2ch(&local_58,pbVar13,' ');
          pbVar10 = local_58;
          if (uVar4 == '\0') goto LAB_00150508;
          if (0 < (long)local_58 - (long)pbVar19) {
            iVar5 = (*args->on_query)(args->parser,(char *)pbVar19,(long)local_58 - (long)pbVar19);
            goto LAB_0015015f;
          }
        }
        if ((pbVar13 <= pbVar10 + 6) ||
           (iVar5 = (*args->on_http_version)
                              (args->parser,(char *)(pbVar10 + 1),
                               (long)pbVar13 - (long)(pbVar10 + 1)), iVar5 != 0)) goto LAB_00150508;
        if (pbVar16 != (byte *)0x0) {
          iVar5 = (*args->on_header)(args->parser,"host",4,(char *)pbVar16,
                                     (long)local_40 - (long)pbVar16);
          goto LAB_001501ae;
        }
      }
    }
    local_50 = puVar18 + 1;
    phVar11 = args->parser;
    puVar18 = &(phVar11->state).reserved;
    *puVar18 = *puVar18 | 1;
    pbVar17 = local_50;
    end = local_50;
LAB_001501cd:
    do {
      if (local_38 <= pbVar17) {
LAB_00150522:
        return (long)pbVar17 - (long)args->buffer;
      }
      if ((*pbVar17 == 10) || (*pbVar17 == 0xd)) break;
      bVar3 = seek2eol(&end,local_38);
      puVar18 = end;
      if (bVar3 == 0) goto LAB_00150522;
      puVar20 = end + (1 - (ulong)bVar3);
      local_58 = pbVar17;
      uVar4 = seek2ch(&local_58,puVar20,':');
      pbVar10 = local_58;
      pbVar16 = pbVar17;
      if (uVar4 == '\0') goto LAB_00150508;
      for (; pbVar16 < pbVar10; pbVar16 = pbVar16 + 1) {
        pp_Var6 = __ctype_tolower_loc();
        *pbVar16 = *(byte *)(*pp_Var6 + *pbVar16);
      }
      pbVar16 = pbVar10 + 1;
      if (pbVar10[1] == 0x20) {
        pbVar16 = pbVar10 + 2;
      }
      sVar14 = (long)pbVar10 - (long)pbVar17;
      if (sVar14 == 7) {
        iVar5 = bcmp(pbVar17,"trailer",7);
        if (iVar5 == 0) {
          puVar15 = &(args->parser->state).reserved;
          *puVar15 = *puVar15 | 0x60;
        }
      }
      else if (sVar14 == 0xe) {
        iVar5 = bcmp(pbVar17,"content-length",0xe);
        if (iVar5 == 0) {
          lVar9 = atol((char *)pbVar16);
          (args->parser->state).content_length = lVar9;
        }
      }
      else if (((sVar14 == 0x11) && (iVar5 = bcmp(pbVar17,"transfer-encoding",0x11), iVar5 == 0)) &&
              (iVar5 = bcmp(pbVar16,"chunked",7), iVar5 != 0)) {
        puVar15 = &(args->parser->state).reserved;
        *puVar15 = *puVar15 | 0x40;
      }
      iVar5 = (*args->on_header)(args->parser,(char *)pbVar17,sVar14,(char *)pbVar16,
                                 (long)puVar20 - (long)pbVar16);
      if (iVar5 != 0) goto LAB_00150508;
      pbVar17 = puVar18 + 1;
      phVar11 = args->parser;
      end = pbVar17;
    } while (((phVar11->state).reserved & 2) == 0);
    local_50 = pbVar17 + 1;
    if (pbVar17[1] == 10) {
      local_50 = pbVar17 + 2;
    }
    bVar3 = (phVar11->state).reserved | 2;
    (phVar11->state).reserved = bVar3;
    end = local_50;
  }
  else if (bVar8 != 3) {
    if (bVar8 == 1) goto LAB_001501cd;
    goto LAB_001504ea;
  }
  lVar9 = (phVar11->state).content_length;
  if (lVar9 < 1) {
    if ((bVar3 & 0x40) != 0) {
      pbVar17 = (byte *)((long)args->buffer + args->length);
      local_58 = local_50;
      do {
        if (pbVar17 <= local_50) {
LAB_001504e7:
          phVar11 = args->parser;
          goto LAB_001504ea;
        }
        if (lVar9 == 0) {
          for (; (pbVar10 = local_50, local_50 < pbVar17 &&
                 ((*local_50 == 0xd || (*local_50 == 10)))); local_50 = local_50 + 1) {
          }
          bVar3 = seek2eol(&local_58,pbVar17);
          pbVar16 = local_58;
          if (bVar3 == 0) goto LAB_001504e7;
          pbVar13 = local_58;
          if (local_58 < pbVar10 + bVar3) {
            local_50 = local_58;
            if (local_58 == (byte *)0x0) {
              pbVar13 = (byte *)0x0;
              pbVar10 = (byte *)0x0;
            }
            else {
              uVar4 = seek2eol(&local_58,pbVar17);
              pbVar13 = local_58;
              pbVar10 = pbVar16;
              if (uVar4 == '\0') goto LAB_001504e7;
            }
          }
          lVar7 = strtol((char *)pbVar10,(char **)0x0,0x10);
          lVar9 = -lVar7;
          phVar11 = args->parser;
          (phVar11->state).content_length = lVar9;
          local_50 = pbVar13 + 1;
          if (lVar7 == 0) goto LAB_00150484;
        }
        pbVar10 = local_50 + -lVar9;
        if (pbVar17 < local_50 + -lVar9) {
          pbVar10 = pbVar17;
        }
        sVar14 = (long)pbVar10 - (long)local_50;
        local_58 = pbVar10;
        if (local_50 <= pbVar10 && sVar14 != 0) {
          sVar14 = (long)pbVar10 - (long)local_50;
          iVar5 = (*args->on_body_chunk)(phVar11,(char *)local_50,sVar14);
          if (iVar5 != 0) goto LAB_00150508;
          phVar11 = args->parser;
          lVar9 = (phVar11->state).content_length;
        }
        psVar1 = &(phVar11->state).read;
        *psVar1 = *psVar1 + sVar14;
        lVar9 = lVar9 + sVar14;
        (phVar11->state).content_length = lVar9;
        local_50 = pbVar10;
      } while( true );
    }
  }
  else {
    lVar7 = (phVar11->state).read;
    if (lVar7 < lVar9) {
      pbVar17 = (byte *)((long)args->buffer + args->length);
      if (local_50 + (lVar9 - lVar7) <= pbVar17) {
        pbVar17 = local_50 + (lVar9 - lVar7);
      }
      sVar14 = (long)pbVar17 - (long)local_50;
      if (local_50 <= pbVar17 && sVar14 != 0) {
        sVar14 = (long)pbVar17 - (long)local_50;
        iVar5 = (*args->on_body_chunk)(phVar11,(char *)local_50,sVar14);
        if (iVar5 != 0) goto LAB_00150508;
        phVar11 = args->parser;
        lVar9 = (phVar11->state).content_length;
        lVar7 = (phVar11->state).read;
      }
      (phVar11->state).read = sVar14 + lVar7;
      local_50 = pbVar17;
      if (lVar9 <= (long)(sVar14 + lVar7)) {
        puVar18 = &(phVar11->state).reserved;
        *puVar18 = *puVar18 | 4;
      }
      goto LAB_001504ea;
    }
  }
  (phVar11->state).reserved = bVar3 | 4;
  goto LAB_001504ea;
LAB_00150484:
  (phVar11->state).content_length = (phVar11->state).read;
  uVar4 = seek2eol(&local_50,pbVar17);
  if (uVar4 != '\0') {
    local_50 = local_50 + 1;
  }
  phVar11 = args->parser;
  bVar8 = (phVar11->state).reserved;
  bVar3 = bVar8 & 0xdd;
  bVar21 = (bVar8 & 0x20) == 0;
  bVar12 = bVar3;
  if (bVar21) {
    bVar12 = bVar8 | 4;
  }
  (phVar11->state).reserved = bVar12;
  if (bVar21) {
LAB_001504ea:
    pbVar17 = local_50;
    bVar3 = (phVar11->state).reserved;
    if ((bVar3 & 4) != 0) {
      (phVar11->state).next = local_50;
      iVar5 = (*(&args->on_request)[bVar3 >> 7])(phVar11);
      if (iVar5 != 0) {
LAB_00150508:
        (*args->on_error)(args->parser);
        phVar11 = args->parser;
        (phVar11->state).content_length = 0;
        (phVar11->state).read = 0;
        (phVar11->state).next = (uint8_t *)0x0;
        *(undefined8 *)&(phVar11->state).reserved = 0;
        return args->length;
      }
      phVar11 = args->parser;
      (phVar11->state).next = (uint8_t *)0x0;
      *(undefined8 *)&(phVar11->state).reserved = 0;
      (phVar11->state).content_length = 0;
      (phVar11->state).read = 0;
    }
LAB_00150539:
    return (long)pbVar17 - (long)args->buffer;
  }
  goto LAB_0014fe82;
}

Assistant:

size_t http1_fio_parser_fn(struct http1_fio_parser_args_s *args) {
  assert(args->parser && args->buffer);
  args->parser->state.next = NULL;
  uint8_t *start = args->buffer;
  uint8_t *end = start;
  uint8_t *const stop = start + args->length;
  uint8_t eol_len = 0;
#define CONSUMED ((size_t)((uintptr_t)start - (uintptr_t)args->buffer))
// fprintf(stderr, "** resuming with at %p with %.*s...(%lu)\n", args->buffer,
// 4,
//         start, args->length);
re_eval:
  switch ((args->parser->state.reserved & 15)) {

  /* request / response line */
  case 0:
    /* clear out any leadinng white space */
    while ((start < stop) &&
           (*start == '\r' || *start == '\n' || *start == ' ' || *start == 0)) {
      ++start;
    }
    end = start;
    /* make sure the whole line is available*/
    if (!(eol_len = seek2eol(&end, stop)))
      return CONSUMED;

    if (start[0] == 'H' && start[1] == 'T' && start[2] == 'T' &&
        start[3] == 'P') {
      /* HTTP response */
      if (consume_response_line(args, start, end - eol_len + 1))
        goto error;
    } else if (tolower(start[0]) >= 'a' && tolower(start[0]) <= 'z') {
      /* HTTP request */
      if (consume_request_line(args, start, end - eol_len + 1))
        goto error;
    }
    end = start = end + 1;
    args->parser->state.reserved |= 1;

  /* fallthrough */
  /* headers */
  case 1:
    do {
      if (start >= stop)
        return CONSUMED; /* buffer ended on header line */
      if (*start == '\r' || *start == '\n') {
        goto finished_headers; /* empty line, end of headers */
      }
      if (!(eol_len = seek2eol(&end, stop)))
        return CONSUMED;
      if (consume_header(args, start, end - eol_len + 1))
        goto error;
      end = start = end + 1;
    } while ((args->parser->state.reserved & 2) == 0);
  finished_headers:
    ++start;
    if (*start == '\n')
      ++start;
    end = start;
    args->parser->state.reserved |= 2;
  /* fallthrough */
  /* request body */
  case 3: { /*  2 | 1 == 3 */
    int t3 = consume_body(args, &start);
    switch (t3) {
    case -1:
      goto error;
    case -2:
      goto re_eval;
    }
    break;
  }
  }
  /* are we done ? */
  if (args->parser->state.reserved & 4) {
    args->parser->state.next = start;
    if (((args->parser->state.reserved & 128) ? args->on_response
                                              : args->on_request)(args->parser))
      goto error;
    args->parser->state =
        (struct http1_parser_protected_read_only_state_s){0, 0, 0};
  }
  return CONSUMED;
error:
  args->on_error(args->parser);
  args->parser->state =
      (struct http1_parser_protected_read_only_state_s){0, 0, 0};
  return args->length;
}